

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O3

void __thiscall
lzham::task_pool::task_pool(task_pool *this,lzham_malloc_context malloc_context,uint num_threads)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = pthread_spin_init((pthread_spinlock_t *)this,0);
  if (iVar2 != 0) {
    lzham_fail("\"spinlock: pthread_spin_init() failed\"",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
               ,0xe7);
  }
  lVar3 = 8;
  do {
    puVar1 = (undefined8 *)((long)&(this->m_task_stack).m_stack[0].m_data + lVar3 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_task_stack).m_stack + lVar3 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x808);
  (this->m_task_stack).m_top = 0;
  this->m_num_threads = 0;
  iVar2 = sem_init((sem_t *)&this->m_tasks_available,0,0);
  if (iVar2 != 0) {
    lzham_fail("\"semaphore: sem_init() failed\"",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
               ,0x80);
  }
  this->m_malloc_context = malloc_context;
  this->m_num_outstanding_tasks = 0;
  this->m_exit_flag = 0;
  memset(this->m_threads,0,0x200);
  iVar2 = init(this,(EVP_PKEY_CTX *)(ulong)num_threads);
  if ((char)iVar2 == '\0') {
    lzham_assert("status",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.cpp"
                 ,0x2d);
  }
  return;
}

Assistant:

task_pool::task_pool(lzham_malloc_context malloc_context, uint num_threads) :
      m_task_stack(malloc_context),
      m_num_threads(0),
      m_tasks_available(0, 32767),
      m_malloc_context(malloc_context),
      m_num_outstanding_tasks(0),
      m_exit_flag(false)
   {
      utils::zero_object(m_threads);

      bool status = init(num_threads);
      LZHAM_VERIFY(status);
   }